

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fortran_array_view.cpp
# Opt level: O0

void __thiscall
cpp_bindgen::cpp_bindgen::anon_unknown_0::
FortranArrayView_BindableStaticHypercubeWithConstructorIsBindable_Test::
~FortranArrayView_BindableStaticHypercubeWithConstructorIsBindable_Test
          (FortranArrayView_BindableStaticHypercubeWithConstructorIsBindable_Test *this)

{
  FortranArrayView_BindableStaticHypercubeWithConstructorIsBindable_Test *this_local;
  
  ~FortranArrayView_BindableStaticHypercubeWithConstructorIsBindable_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FortranArrayView, BindableStaticHypercubeWithConstructorIsBindable) {
                double data[2][2][2][2] = {
                    {{{1., 2.}, {3., 4.}}, {{5., 6.}, {7., 8.}}}, {{{9., 10.}, {11., 12.}}, {{13., 14.}, {15., 16.}}}};
                bindgen_fortran_array_descriptor descriptor{bindgen_fk_Double, 4, {2, 2, 2, 2}, &data[0]};

                BindableStaticHypercubeWithConstructor<4> view =
                    make_fortran_array_view<BindableStaticHypercubeWithConstructor<4>>(&descriptor);
                EXPECT_EQ(view(0, 1, 0, 1), 6.);
                EXPECT_EQ(view(1, 0, 1, 0), 11.);
            }